

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

Person * __thiscall Controller::findPersonByName(Controller *this,string *name)

{
  __type _Var1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  string sStack_48;
  
  p_Var3 = (_List_node_base *)&this->players;
  do {
    p_Var3 = (((_List_base<Person_*,_std::allocator<Person_*>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->players) {
      poVar2 = std::operator<<((ostream *)&std::cout,"La personne ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      poVar2 = std::operator<<(poVar2," n\'existe pas");
      std::endl<char,std::char_traits<char>>(poVar2);
      return (Person *)0x0;
    }
    Person::getName_abi_cxx11_(&sStack_48,(Person *)p_Var3[1]._M_next);
    _Var1 = std::operator==(&sStack_48,name);
    std::__cxx11::string::~string((string *)&sStack_48);
  } while (!_Var1);
  return (Person *)p_Var3[1]._M_next;
}

Assistant:

Person* Controller::findPersonByName(const string& name) const {
    // Searches in the list of persons
    auto it = std::find_if(players.begin(), players.end(),
               [&name](const Person* p) {return p->getName() == name;});
    if (it == players.end()) {
        cout << "La personne " << name << " n'existe pas" << endl;
        return nullptr;
    }
    return *it;
}